

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaSi.cpp
# Opt level: O0

PT __thiscall Hpipe::DaSi::find(DaSi *this,char c)

{
  PT local_20;
  PT i;
  char c_local;
  DaSi *this_local;
  
  for (local_20 = 0; (local_20 != *(PT *)(this + 8) && (*(char *)(*(long *)this + local_20) != c));
      local_20 = local_20 + 1) {
  }
  return local_20;
}

Assistant:

PT DaSi::find( char c ) const {
    for( PT i = 0; ; ++i )
        if ( i == size or data[ i ] == c )
            return i;
}